

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film_grain_table_test.cc
# Opt level: O2

void __thiscall
FilmGrainEncodeTest_InitMonochrome1EncodeMonochrome0_Test::TestBody
          (FilmGrainEncodeTest_InitMonochrome1EncodeMonochrome0_Test *this)

{
  aom_codec_err_t aVar1;
  aom_codec_iface_t *iface;
  pointer *__ptr;
  long *plVar2;
  SEARCH_METHODS *pSVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_4b8;
  AssertionResult gtest_ar_5;
  AssertHelper local_4a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  aom_codec_err_t init_status;
  aom_codec_ctx_t enc;
  aom_image_t img;
  aom_codec_enc_cfg_t cfg;
  
  iface = aom_codec_av1_cx();
  enc.name._0_4_ = aom_codec_enc_config_default(iface,&cfg,1);
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = AOM_CODEC_OK;
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&img,"aom_codec_enc_config_default(iface, &cfg, usage)","AOM_CODEC_OK",
             (aom_codec_err_t *)&enc,(aom_codec_err_t *)&buffer);
  if ((undefined1)img.fmt == AOM_IMG_FMT_NONE) {
    testing::Message::Message((Message *)&enc);
    if (img._8_8_ == 0) {
      pSVar3 = "";
    }
    else {
      pSVar3 = *(SEARCH_METHODS **)img._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&buffer,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x167,(char *)pSVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&buffer,(Message *)&enc);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buffer);
    plVar2 = (long *)CONCAT44(enc.name._4_4_,(aom_codec_err_t)enc.name);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&img.tc);
    cfg.g_w = 0x160;
    cfg.g_h = 0x120;
    cfg.monochrome = 1;
    init_status = aom_codec_enc_init_ver(&enc,iface,&cfg,0,0x1d);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = AOM_CODEC_OK;
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)&img,"init_status","AOM_CODEC_OK",&init_status,(aom_codec_err_t *)&buffer
              );
    if ((undefined1)img.fmt == AOM_IMG_FMT_NONE) {
      testing::Message::Message((Message *)&buffer);
      if (img._8_8_ == 0) {
        pSVar3 = "";
      }
      else {
        pSVar3 = *(SEARCH_METHODS **)img._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                 ,0x16e,(char *)pSVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&buffer);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&img.tc);
      buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = aom_codec_control(&enc,0xd,7);
      gtest_ar_5.success_ = false;
      gtest_ar_5._1_3_ = 0;
      testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                ((internal *)&img,"aom_codec_control(&enc, AOME_SET_CPUUSED, 7)","AOM_CODEC_OK",
                 (aom_codec_err_t *)&buffer,(aom_codec_err_t *)&gtest_ar_5);
      if ((undefined1)img.fmt == AOM_IMG_FMT_NONE) {
        testing::Message::Message((Message *)&buffer);
        if (img._8_8_ == 0) {
          pSVar3 = "";
        }
        else {
          pSVar3 = *(SEARCH_METHODS **)img._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                   ,0x16f,(char *)pSVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&buffer);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&img.tc);
        buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = aom_codec_control(&enc,0x2b,2);
        gtest_ar_5.success_ = false;
        gtest_ar_5._1_3_ = 0;
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&img,
                   "aom_codec_control(&enc, AV1E_SET_TUNE_CONTENT, AOM_CONTENT_FILM)","AOM_CODEC_OK"
                   ,(aom_codec_err_t *)&buffer,(aom_codec_err_t *)&gtest_ar_5);
        if ((undefined1)img.fmt == AOM_IMG_FMT_NONE) {
          testing::Message::Message((Message *)&buffer);
          if (img._8_8_ == 0) {
            pSVar3 = "";
          }
          else {
            pSVar3 = *(SEARCH_METHODS **)img._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_5,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                     ,0x171,(char *)pSVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&buffer)
          ;
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&img.tc);
          buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = aom_codec_control(&enc,0x72,1);
          gtest_ar_5.success_ = false;
          gtest_ar_5._1_3_ = 0;
          testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                    ((internal *)&img,"aom_codec_control(&enc, AV1E_SET_DENOISE_NOISE_LEVEL, 1)",
                     "AOM_CODEC_OK",(aom_codec_err_t *)&buffer,(aom_codec_err_t *)&gtest_ar_5);
          if ((undefined1)img.fmt != AOM_IMG_FMT_NONE) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&img.tc);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&buffer,0x25340,(allocator_type *)&img);
            local_4b8._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&img;
            local_4a0.data_ =
                 (AssertHelperData *)
                 aom_img_wrap(&img,AOM_IMG_FMT_I420,0x160,0x120,1,
                              (uchar *)CONCAT44(buffer.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                (aom_codec_err_t)
                                                buffer.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start));
            testing::internal::CmpHelperEQ<aom_image*,aom_image*>
                      ((internal *)&gtest_ar_5,"&img",
                       "aom_img_wrap(&img, AOM_IMG_FMT_I420, kWidth, kHeight, 1, buffer.data())",
                       (aom_image **)&local_4b8,(aom_image **)&local_4a0);
            if (gtest_ar_5.success_ == false) {
              testing::Message::Message((Message *)&local_4b8);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_5.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pSVar3 = "";
              }
              else {
                pSVar3 = *(SEARCH_METHODS **)
                          gtest_ar_5.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_4a0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                         ,0x17a,(char *)pSVar3);
              testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4b8);
              testing::internal::AssertHelper::~AssertHelper(&local_4a0);
              if ((aom_image_t *)local_4b8._M_head_impl != (aom_image_t *)0x0) {
                (**(code **)(*(long *)local_4b8._M_head_impl + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_5.message_);
            aVar1 = aom_codec_encode(&enc,&img,0,1,0);
            local_4b8._M_head_impl._0_4_ = aVar1;
            local_4a0.data_ = local_4a0.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                      ((internal *)&gtest_ar_5,"aom_codec_encode(&enc, &img, 0, 1, 0)",
                       "AOM_CODEC_OK",(aom_codec_err_t *)&local_4b8,(aom_codec_err_t *)&local_4a0);
            if (gtest_ar_5.success_ == false) {
              testing::Message::Message((Message *)&local_4b8);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_5.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pSVar3 = "";
              }
              else {
                pSVar3 = *(SEARCH_METHODS **)
                          gtest_ar_5.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_4a0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                         ,0x17c,(char *)pSVar3);
              testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4b8);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_5.message_);
              cfg.monochrome = 0;
              aVar1 = aom_codec_enc_config_set(&enc,&cfg);
              local_4b8._M_head_impl._0_4_ = aVar1;
              local_4a0.data_._0_4_ = 8;
              testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                        ((internal *)&gtest_ar_5,"aom_codec_enc_config_set(&enc, &cfg)",
                         "AOM_CODEC_INVALID_PARAM",(aom_codec_err_t *)&local_4b8,
                         (aom_codec_err_t *)&local_4a0);
              if (gtest_ar_5.success_ != false) {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_5.message_);
                aVar1 = aom_codec_destroy(&enc);
                local_4b8._M_head_impl._0_4_ = aVar1;
                local_4a0.data_ = local_4a0.data_ & 0xffffffff00000000;
                testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                          ((internal *)&gtest_ar_5,"aom_codec_destroy(&enc)","AOM_CODEC_OK",
                           (aom_codec_err_t *)&local_4b8,(aom_codec_err_t *)&local_4a0);
                if (gtest_ar_5.success_ == false) {
                  testing::Message::Message((Message *)&local_4b8);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar_5.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pSVar3 = "";
                  }
                  else {
                    pSVar3 = *(SEARCH_METHODS **)
                              gtest_ar_5.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_4a0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                             ,0x180,(char *)pSVar3);
                  testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4b8);
                  testing::internal::AssertHelper::~AssertHelper(&local_4a0);
                  if (local_4b8._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_4b8._M_head_impl + 8))();
                  }
                }
                goto LAB_0049bca6;
              }
              testing::Message::Message((Message *)&local_4b8);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_5.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pSVar3 = "";
              }
              else {
                pSVar3 = *(SEARCH_METHODS **)
                          gtest_ar_5.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_4a0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                         ,0x17f,(char *)pSVar3);
              testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4b8);
            }
            testing::internal::AssertHelper::~AssertHelper(&local_4a0);
            if (local_4b8._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_4b8._M_head_impl + 8))();
            }
LAB_0049bca6:
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_5.message_);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            return;
          }
          testing::Message::Message((Message *)&buffer);
          if (img._8_8_ == 0) {
            pSVar3 = "";
          }
          else {
            pSVar3 = *(SEARCH_METHODS **)img._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_5,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                     ,0x173,(char *)pSVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&buffer)
          ;
        }
      }
    }
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    plVar2 = (long *)CONCAT44(buffer.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (aom_codec_err_t)
                              buffer.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  }
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&img.tc);
  return;
}

Assistant:

TEST(FilmGrainEncodeTest, InitMonochrome1EncodeMonochrome0) {
  const int kWidth = 352;
  const int kHeight = 288;
  const int usage = AOM_USAGE_REALTIME;
  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  ASSERT_EQ(aom_codec_enc_config_default(iface, &cfg, usage), AOM_CODEC_OK);
  aom_codec_ctx_t enc;
  cfg.g_w = kWidth;
  cfg.g_h = kHeight;
  // Initialize encoder, with monochrome = 0.
  cfg.monochrome = 1;
  aom_codec_err_t init_status = aom_codec_enc_init(&enc, iface, &cfg, 0);
  ASSERT_EQ(init_status, AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AOME_SET_CPUUSED, 7), AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_TUNE_CONTENT, AOM_CONTENT_FILM),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_DENOISE_NOISE_LEVEL, 1),
            AOM_CODEC_OK);
  // Set image with zero values.
  constexpr size_t kBufferSize =
      kWidth * kHeight + 2 * (kWidth + 1) / 2 * (kHeight + 1) / 2;
  std::vector<unsigned char> buffer(kBufferSize);
  aom_image_t img;
  EXPECT_EQ(&img, aom_img_wrap(&img, AOM_IMG_FMT_I420, kWidth, kHeight, 1,
                               buffer.data()));
  // Encode first frame.
  ASSERT_EQ(aom_codec_encode(&enc, &img, 0, 1, 0), AOM_CODEC_OK);
  // Second frame: update config with monochrome = 1.
  cfg.monochrome = 0;
  ASSERT_EQ(aom_codec_enc_config_set(&enc, &cfg), AOM_CODEC_INVALID_PARAM);
  ASSERT_EQ(aom_codec_destroy(&enc), AOM_CODEC_OK);
}